

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O2

UBool generateFromUTable(CnvExtData *extData,UCMTable *table,int32_t start,int32_t limit,
                        int32_t unitIndex,uint32_t defaultValue)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  UCMapping *pUVar4;
  int32_t *piVar5;
  UBool UVar6;
  int iVar7;
  uint32_t defaultValue_00;
  uint32_t uVar8;
  UCMapping *pUVar9;
  long lVar10;
  undefined2 *puVar11;
  uint32_t *puVar12;
  ushort uVar13;
  long lVar14;
  uint uVar15;
  uint32_t limit_00;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t start_00;
  
  pUVar4 = table->mappings;
  piVar5 = table->reverseMap;
  lVar16 = (long)start;
  pUVar9 = pUVar4 + piVar5[lVar16];
  if (pUVar4[piVar5[lVar16]].uLen != '\x01') {
    pUVar9 = (UCMapping *)(table->codePoints + pUVar9->u);
  }
  lVar14 = (long)unitIndex;
  uVar1 = *(ushort *)((long)&pUVar9->u + lVar14 * 2);
  uVar15 = 1;
  lVar10 = lVar16;
  uVar13 = uVar1;
  while (lVar10 = lVar10 + 1, lVar10 < limit) {
    pUVar9 = pUVar4 + piVar5[lVar10];
    if (pUVar4[piVar5[lVar10]].uLen != '\x01') {
      pUVar9 = (UCMapping *)(table->codePoints + pUVar9->u);
    }
    uVar2 = *(ushort *)((long)&pUVar9->u + lVar14 * 2);
    uVar15 = uVar15 + (uVar13 != uVar2);
    uVar13 = uVar2;
  }
  puVar11 = (undefined2 *)utm_allocN(extData->fromUTableUChars,uVar15 + 1);
  puVar12 = (uint32_t *)utm_allocN(extData->fromUTableValues,uVar15 + 1);
  *puVar11 = (short)uVar15;
  *puVar12 = defaultValue;
  uVar17 = uVar1 - 1;
  iVar7 = 0;
  for (; lVar16 < limit; lVar16 = lVar16 + 1) {
    pUVar9 = pUVar4 + piVar5[lVar16];
    if (pUVar4[piVar5[lVar16]].uLen != '\x01') {
      pUVar9 = (UCMapping *)(table->codePoints + pUVar9->u);
    }
    uVar1 = *(ushort *)((long)&pUVar9->u + lVar14 * 2);
    if (uVar17 != uVar1) {
      puVar11[(long)iVar7 + 1] = uVar1;
      puVar12[(long)iVar7 + 1] = (uint32_t)lVar16;
      iVar7 = iVar7 + 1;
      uVar17 = (uint)uVar1;
    }
  }
  iVar7 = unitIndex + 1;
  uVar18 = 1;
  start_00 = puVar12[1];
  do {
    if (uVar18 - uVar15 == 1) {
      return '\x01';
    }
    limit_00 = limit;
    if (uVar18 < uVar15) {
      limit_00 = puVar12[uVar18 + 1];
    }
    iVar3 = piVar5[(int)start_00];
    defaultValue_00 = 0;
    if (iVar7 == pUVar4[iVar3].uLen) {
      start_00 = start_00 + 1;
      if (((int)start_00 < (int)limit_00) && (iVar7 == pUVar4[piVar5[(int)start_00]].uLen)) {
        fwrite("error: multiple mappings from same Unicode code points\n",0x37,1,_stderr);
        ucm_printMapping(table,pUVar4 + iVar3,(FILE *)_stderr);
        ucm_printMapping(table,pUVar4 + piVar5[(int)start_00],(FILE *)_stderr);
        return '\0';
      }
      defaultValue_00 = getFromUBytesValue(extData,table,pUVar4 + iVar3);
    }
    if (start_00 == limit_00) {
      puVar12[uVar18] = defaultValue_00;
    }
    else {
      uVar8 = utm_countItems(extData->fromUTableValues);
      puVar12[uVar18] = uVar8;
      UVar6 = generateFromUTable(extData,table,start_00,limit_00,iVar7,defaultValue_00);
      if (UVar6 == '\0') {
        return '\0';
      }
    }
    uVar18 = uVar18 + 1;
    start_00 = limit_00;
  } while( true );
}

Assistant:

static UBool
generateFromUTable(CnvExtData *extData, UCMTable *table,
                   int32_t start, int32_t limit, int32_t unitIndex,
                   uint32_t defaultValue) {
    UCMapping *mappings, *m;
    int32_t *map;
    int32_t i, j, uniqueCount, count, subStart, subLimit;

    UChar *uchars;
    UChar32 low, high, prev;

    UChar *sectionUChars;
    uint32_t *sectionValues;

    mappings=table->mappings;
    map=table->reverseMap;

    /* step 1: examine the input units; set low, high, uniqueCount */
    m=mappings+map[start];
    uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
    low=uchars[unitIndex];
    uniqueCount=1;

    prev=high=low;
    for(i=start+1; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            prev=high;
            ++uniqueCount;
        }
    }

    /* step 2: allocate the section; set count, section */
    /* the fromUTable always stores for access via binary search */
    count=uniqueCount;

    /* allocate the section: 1 entry for the header + count for the items */
    sectionUChars=(UChar *)utm_allocN(extData->fromUTableUChars, 1+count);
    sectionValues=(uint32_t *)utm_allocN(extData->fromUTableValues, 1+count);

    /* write the section header */
    *sectionUChars++=(UChar)count;
    *sectionValues++=defaultValue;

    /* step 3: write temporary section table with subsection starts */
    prev=low-1; /* just before low to prevent empty subsections before low */
    j=0; /* section table index */
    for(i=start; i<limit; ++i) {
        m=mappings+map[i];
        uchars=(UChar *)UCM_GET_CODE_POINTS(table, m);
        high=uchars[unitIndex];

        if(high!=prev) {
            /* start of a new subsection for unit high */
            prev=high;

            /* write the entry with the subsection start */
            sectionUChars[j]=(UChar)high;
            sectionValues[j]=(uint32_t)i;
            ++j;
        }
    }
    /* assert(j==count) */

    /* step 4: recurse and write results */
    subLimit=(int32_t)(sectionValues[0]);
    for(j=0; j<count; ++j) {
        subStart=subLimit;
        subLimit= (j+1)<count ? (int32_t)(sectionValues[j+1]) : limit;

        /* see if there is exactly one input unit sequence of length unitIndex+1 */
        defaultValue=0;
        m=mappings+map[subStart];
        if(m->uLen==unitIndex+1) {
            /* do not include this in generateToUTable() */
            ++subStart;

            if(subStart<subLimit && mappings[map[subStart]].uLen==unitIndex+1) {
                /* print error for multiple same-input-sequence mappings */
                fprintf(stderr, "error: multiple mappings from same Unicode code points\n");
                ucm_printMapping(table, m, stderr);
                ucm_printMapping(table, mappings+map[subStart], stderr);
                return FALSE;
            }

            defaultValue=getFromUBytesValue(extData, table, m);
        }

        if(subStart==subLimit) {
            /* write the result for the input sequence ending here */
            sectionValues[j]=defaultValue;
        } else {
            /* write the index to the subsection table */
            sectionValues[j]=(uint32_t)utm_countItems(extData->fromUTableValues);

            /* recurse */
            if(!generateFromUTable(extData, table, subStart, subLimit, unitIndex+1, defaultValue)) {
                return FALSE;
            }
        }
    }
    return TRUE;
}